

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

void __thiscall Token::Token(Token *this,TokenType type)

{
  this->mType = type;
  NumericConstant::NumericConstant(&this->mNumericValue);
  this->mCharValue = '\0';
  this->mCharValue2 = '\0';
  (this->mIdentifier)._M_dataplus._M_p = (pointer)&(this->mIdentifier).field_2;
  (this->mIdentifier)._M_string_length = 0;
  (this->mIdentifier).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Token::Token(TokenType type)
	: mType(type),
	  mNumericValue(),
	  mCharValue(0),
	  mCharValue2(0) {

}